

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::internal::DeathTestAbort(String *message)

{
  int fd;
  UnitTestImpl *this;
  InternalRunDeathTestFlag *this_00;
  FILE *pFVar1;
  char *pcVar2;
  FILE *parent;
  InternalRunDeathTestFlag *flag;
  String *message_local;
  
  this = GetUnitTestImpl();
  this_00 = UnitTestImpl::internal_run_death_test_flag(this);
  pFVar1 = _stderr;
  if (this_00 != (InternalRunDeathTestFlag *)0x0) {
    fd = InternalRunDeathTestFlag::write_fd(this_00);
    pFVar1 = (FILE *)posix::FDOpen(fd,"w");
    fputc(0x49,pFVar1);
    pcVar2 = String::c_str(message);
    fprintf(pFVar1,"%s",pcVar2);
    fflush(pFVar1);
    _exit(1);
  }
  pcVar2 = String::c_str(message);
  fprintf(pFVar1,"%s",pcVar2);
  fflush(_stderr);
  abort();
}

Assistant:

void DeathTestAbort(const String& message) {
  // On a POSIX system, this function may be called from a threadsafe-style
  // death test child process, which operates on a very small stack.  Use
  // the heap for any additional non-minuscule memory requirements.
  const InternalRunDeathTestFlag* const flag =
      GetUnitTestImpl()->internal_run_death_test_flag();
  if (flag != NULL) {
    FILE* parent = posix::FDOpen(flag->write_fd(), "w");
    fputc(kDeathTestInternalError, parent);
    fprintf(parent, "%s", message.c_str());
    fflush(parent);
    _exit(1);
  } else {
    fprintf(stderr, "%s", message.c_str());
    fflush(stderr);
    abort();
  }
}